

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O1

void __thiscall interfaces_tests::findCommonAncestor::test_method(findCommonAncestor *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  int *piVar1;
  CKey *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppCVar4;
  uint256 *puVar5;
  Chain *pCVar6;
  lazy_ostream *plVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [8];
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar17;
  Chainstate *pCVar18;
  Chainstate *this_01;
  CBlockIndex *pindex;
  int iVar19;
  char *pcVar20;
  iterator in_R9;
  iterator pvVar21;
  iterator pvVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  check_type cVar29;
  CBlockIndex *local_410;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 local_368 [16];
  undefined1 *local_358;
  undefined1 *local_350;
  uint256 *local_348;
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_340;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  int orig_height;
  int fork_height;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  char *pcStack_220;
  undefined1 local_218 [16];
  unkbyte9 Stack_208;
  undefined7 local_1ff;
  unkbyte9 Stack_1f8;
  undefined7 uStack_1ef;
  assertion_result local_1e8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [8];
  undefined8 uStack_190;
  undefined1 local_188 [16];
  unkbyte9 local_178;
  undefined7 uStack_16f;
  unkbyte9 local_168;
  undefined7 uStack_15f;
  BlockValidationState state;
  uint256 orig_hash;
  uint256 active_hash;
  uint256 fork_hash;
  CBlock local_a8;
  long local_38;
  
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)state.super_ValidationState<BlockValidationResult>._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x65,"test_method","m_node.chainman");
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x65,"operator()","m_node.chainman");
  state.super_ValidationState<BlockValidationResult>._0_9_ = ZEXT89(0x13e7538);
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&state);
  pcVar20 = "m_node.chainman";
  puVar17 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (val,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                       ,0x65,"operator()","m_node.chainman");
  pCVar18 = ChainstateManager::ActiveChainstate
                      ((puVar17->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&state);
  ppCVar4 = (pCVar18->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar4 ==
      (pCVar18->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_410 = (CBlockIndex *)0x0;
  }
  else {
    local_410 = ppCVar4[-1];
  }
  paVar2 = &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  iVar19 = 10;
  paVar3 = &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  do {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = paVar2;
    state.super_ValidationState<BlockValidationResult>._0_16_ = auVar14 << 0x40;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._8_9_ = ZEXT89(0);
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)paVar3;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    this_01 = ChainstateManager::ActiveChainstate
                        ((val->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar4 = (pCVar18->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar4 ==
        (pCVar18->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pindex = (CBlockIndex *)0x0;
    }
    else {
      pindex = ppCVar4[-1];
    }
    Chainstate::InvalidateBlock(this_01,&state,pindex);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
        paVar3) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus
                      ._M_p,CONCAT71(state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_allocated_capacity._1_7_,
                                     state.super_ValidationState<BlockValidationResult>.
                                     m_debug_message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
        paVar2) {
      operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus
                      ._M_p,state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                            field_2._M_allocated_capacity + 1);
    }
    iVar19 = iVar19 + -1;
  } while (iVar19 != 0);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x6b;
  file.m_begin = (iterator)&local_248;
  msg.m_end = in_R9;
  msg.m_begin = pcVar20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_258,msg);
  local_238[8] = 0;
  local_238._0_8_ = &PTR__lazy_ostream_013d3cb0;
  pcStack_220 = "";
  local_228 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  local_1e8._0_4_ =
       (int)((ulong)((long)(pCVar18->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(pCVar18->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -1;
  local_368._0_4_ = local_410->nHeight + -10;
  fork_hash.super_base_blob<256U>.m_data._M_elems[0] = local_1e8._0_4_ == local_368._0_4_;
  fork_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xe7;
  active_hash.super_base_blob<256U>.m_data._M_elems[1] = '?';
  active_hash.super_base_blob<256U>.m_data._M_elems[2] = 0xec;
  active_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[8] = 'I';
  active_hash.super_base_blob<256U>.m_data._M_elems[9] = '@';
  active_hash.super_base_blob<256U>.m_data._M_elems[10] = 0xec;
  active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  orig_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)&local_1e8;
  orig_hash.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)&local_1e8 >> 8);
  orig_hash.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)&local_1e8 >> 0x10);
  orig_hash.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)&local_1e8 >> 0x18);
  orig_hash.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)&local_1e8 >> 0x20);
  orig_hash.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)&local_1e8 >> 0x28);
  orig_hash.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)&local_1e8 >> 0x30);
  orig_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)&local_1e8 >> 0x38);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013d3e70;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)&orig_hash;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_1a8[8] = 0;
  local_1c8._0_8_ = local_368;
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3e70;
  uStack_190 = (undefined8 *)local_1c8;
  local_198 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  pvVar21 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&fork_hash,(lazy_ostream *)local_238,1,2,REQUIRE,0xec42ce,
             (size_t)&active_hash,0x6b,&state,"orig_tip->nHeight - 10",local_1a8);
  piVar1 = &local_410->nHeight;
  boost::detail::shared_count::~shared_count
            ((shared_count *)(fork_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).coinbaseKey;
  CKey::MakeNewKey(this_00,true);
  iVar19 = 0x14;
  do {
    local_238._0_8_ = (_func_int **)0x0;
    local_238[8] = false;
    local_238._9_7_ = 0;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = pcStack_220;
    _local_228 = auVar12 << 0x40;
    CKey::GetPubKey((CPubKey *)&state,this_00);
    GetScriptForRawPubKey((CScript *)local_1a8,(CPubKey *)&state);
    pvVar22 = (iterator)0x0;
    TestChain100Setup::CreateAndProcessBlock
              (&local_a8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,
               (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_238,
               (CScript *)local_1a8,(Chainstate *)0x0);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_a8.vtx);
    if (0x1c < uStack_190._4_4_) {
      free((void *)local_1a8._0_8_);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_1a8._8_8_;
      local_1a8 = auVar13 << 0x40;
    }
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_238);
    iVar19 = iVar19 + -1;
  } while (iVar19 != 0);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x70;
  file_00.m_begin = (iterator)&local_268;
  msg_00.m_end = pvVar21;
  msg_00.m_begin = pvVar22;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
             msg_00);
  local_238[8] = 0;
  local_238._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_228 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  pcStack_220 = "";
  local_1e8._0_4_ =
       (int)((ulong)((long)(pCVar18->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(pCVar18->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -1;
  fork_hash.super_base_blob<256U>.m_data._M_elems[0] = local_1e8._0_4_ == *piVar1 + 10;
  local_368._0_4_ = *piVar1 + 10;
  orig_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)&local_1e8;
  orig_hash.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)&local_1e8 >> 8);
  orig_hash.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)&local_1e8 >> 0x10);
  orig_hash.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)&local_1e8 >> 0x18);
  orig_hash.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)&local_1e8 >> 0x20);
  orig_hash.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)&local_1e8 >> 0x28);
  orig_hash.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)&local_1e8 >> 0x30);
  orig_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)&local_1e8 >> 0x38);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013d3e70;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)&orig_hash;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_1a8[8] = 0;
  fork_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_1a8._0_8_ = &PTR__lazy_ostream_013d3e70;
  uStack_190 = (undefined8 *)local_1c8;
  local_198 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
  active_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xe7;
  active_hash.super_base_blob<256U>.m_data._M_elems[1] = '?';
  active_hash.super_base_blob<256U>.m_data._M_elems[2] = 0xec;
  active_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[8] = 'I';
  active_hash.super_base_blob<256U>.m_data._M_elems[9] = '@';
  active_hash.super_base_blob<256U>.m_data._M_elems[10] = 0xec;
  active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_1c8._0_8_ = local_368;
  pvVar21 = (iterator)0x1;
  pvVar22 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&fork_hash,(lazy_ostream *)local_238,1,2,REQUIRE,0xec42ce,
             (size_t)&active_hash,0x70,&state,"orig_tip->nHeight + 10",(CScript *)local_1a8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(fork_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  fork_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x74;
  file_01.m_begin = (iterator)&local_290;
  msg_01.m_end = pvVar22;
  msg_01.m_begin = pvVar21;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a0,
             msg_01);
  puVar5 = local_410->phashBlock;
  auVar16 = local_228;
  local_1e8._0_8_ = (uint256 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_);
  if (puVar5 != (uint256 *)0x0) {
    pCVar6 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chain._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
    uVar8 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
    uVar9 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
    uVar10 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
    uVar11 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)uVar10;
    active_hash.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)((ulong)uVar10 >> 8);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)((ulong)uVar10 >> 0x10);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)((ulong)uVar10 >> 0x18);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)((ulong)uVar10 >> 0x20);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)((ulong)uVar10 >> 0x28);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)((ulong)uVar10 >> 0x30);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)((ulong)uVar10 >> 0x38);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar11;
    active_hash.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar11 >> 8);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar11 >> 0x10);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar11 >> 0x18);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar11 >> 0x20);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar11 >> 0x28);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar11 >> 0x30);
    active_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar11 >> 0x38);
    active_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)uVar8;
    active_hash.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)uVar8 >> 8);
    active_hash.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)uVar8 >> 0x10);
    active_hash.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)uVar8 >> 0x18);
    active_hash.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)uVar8 >> 0x20);
    active_hash.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)uVar8 >> 0x28);
    active_hash.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)uVar8 >> 0x30);
    active_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)uVar8 >> 0x38);
    active_hash.super_base_blob<256U>.m_data._M_elems[8] = (uchar)uVar9;
    active_hash.super_base_blob<256U>.m_data._M_elems[9] = (uchar)((ulong)uVar9 >> 8);
    active_hash.super_base_blob<256U>.m_data._M_elems[10] = (uchar)((ulong)uVar9 >> 0x10);
    active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)((ulong)uVar9 >> 0x18);
    active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)((ulong)uVar9 >> 0x20);
    active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)((ulong)uVar9 >> 0x28);
    active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)((ulong)uVar9 >> 0x30);
    active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)((ulong)uVar9 >> 0x38);
    puVar5 = (pCVar18->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    local_1e8._0_8_ = (uint256 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_);
    if (puVar5 != (uint256 *)0x0) {
      uVar10 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
      uVar11 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
      uVar8 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
      uVar9 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)uVar8;
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)((ulong)uVar8 >> 8);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)((ulong)uVar8 >> 0x10);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)((ulong)uVar8 >> 0x18);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)((ulong)uVar8 >> 0x20);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)((ulong)uVar8 >> 0x28);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)((ulong)uVar8 >> 0x30);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)((ulong)uVar8 >> 0x38);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar9;
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)uVar9 >> 8);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)uVar9 >> 0x10);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)uVar9 >> 0x18);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)uVar9 >> 0x20);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)uVar9 >> 0x28);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)uVar9 >> 0x30);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)uVar9 >> 0x38);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)uVar10;
      orig_hash.super_base_blob<256U>.m_data._M_elems[1] = (uchar)((ulong)uVar10 >> 8);
      orig_hash.super_base_blob<256U>.m_data._M_elems[2] = (uchar)((ulong)uVar10 >> 0x10);
      orig_hash.super_base_blob<256U>.m_data._M_elems[3] = (uchar)((ulong)uVar10 >> 0x18);
      orig_hash.super_base_blob<256U>.m_data._M_elems[4] = (uchar)((ulong)uVar10 >> 0x20);
      orig_hash.super_base_blob<256U>.m_data._M_elems[5] = (uchar)((ulong)uVar10 >> 0x28);
      orig_hash.super_base_blob<256U>.m_data._M_elems[6] = (uchar)((ulong)uVar10 >> 0x30);
      orig_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)uVar10 >> 0x38);
      orig_hash.super_base_blob<256U>.m_data._M_elems[8] = (uchar)uVar11;
      orig_hash.super_base_blob<256U>.m_data._M_elems[9] = (uchar)((ulong)uVar11 >> 8);
      orig_hash.super_base_blob<256U>.m_data._M_elems[10] = (uchar)((ulong)uVar11 >> 0x10);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xb] = (uchar)((ulong)uVar11 >> 0x18);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xc] = (uchar)((ulong)uVar11 >> 0x20);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xd] = (uchar)((ulong)uVar11 >> 0x28);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xe] = (uchar)((ulong)uVar11 >> 0x30);
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)((ulong)uVar11 >> 0x38);
      stack0xfffffffffffffee8 = SUB169((undefined1  [16])0x0,0);
      state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
      state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
           '\0';
      state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity._1_7_ = 0;
      state.super_ValidationState<BlockValidationResult>._32_16_ = (undefined1  [16])0x0;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._8_16_ =
           (undefined1  [16])0x0;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)&fork_height;
      state.super_ValidationState<BlockValidationResult>._0_8_ = (assertion_result *)&fork_hash;
      local_168 = SUB169((undefined1  [16])0x0,0);
      uStack_15f = 0;
      local_178 = SUB169((undefined1  [16])0x0,0);
      uStack_16f = 0;
      local_188 = (undefined1  [16])0x0;
      _local_198 = (undefined1  [16])0x0;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = &orig_height;
      local_1a8 = auVar15 << 0x40;
      Stack_1f8 = SUB169((undefined1  [16])0x0,7);
      Stack_208 = SUB169((undefined1  [16])0x0,0);
      local_1ff = 0;
      local_218 = (undefined1  [16])0x0;
      _local_228 = (undefined1  [16])0x0;
      local_238._0_8_ = (_func_int **)0x0;
      local_238[8] = false;
      local_238._9_7_ = 0;
      _cVar29 = 0x403c8b;
      iVar19 = (*pCVar6->_vptr_Chain[0xe])(pCVar6,&active_hash,&orig_hash,&state);
      local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)SUB41(iVar19,0);
      local_1e8.m_message.px = (element_type *)0x0;
      local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_368._0_8_ =
           "chain->findCommonAncestor(orig_tip->GetBlockHash(), active.Tip()->GetBlockHash(), FoundBlock().height(fork_height).hash(fork_hash), FoundBlock().height(orig_height))"
      ;
      local_368._8_8_ = "";
      local_1c8[8] = 0;
      local_1c8._0_8_ = &PTR__lazy_ostream_013d3df0;
      local_1b8._8_8_ = local_368;
      local_1b8._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_2b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_2a8 = "";
      pvVar21 = (iterator)0x1;
      pvVar22 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_1e8,(lazy_ostream *)local_1c8,1,0,WARN,_cVar29,(size_t)&local_2b0,0x74);
      boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
      local_2c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_2b8 = "";
      local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = &DAT_00000075;
      file_02.m_begin = (iterator)&local_2c0;
      msg_02.m_end = pvVar22;
      msg_02.m_begin = pvVar21;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2d0,
                 msg_02);
      local_238[8] = 0;
      local_238._0_8_ = &PTR__lazy_ostream_013d3cb0;
      local_228 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      pcStack_220 = "";
      active_hash.super_base_blob<256U>.m_data._M_elems[0] = orig_height == *piVar1;
      active_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xe7;
      orig_hash.super_base_blob<256U>.m_data._M_elems[1] = '?';
      orig_hash.super_base_blob<256U>.m_data._M_elems[2] = 0xec;
      orig_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[8] = 'I';
      orig_hash.super_base_blob<256U>.m_data._M_elems[9] = '@';
      orig_hash.super_base_blob<256U>.m_data._M_elems[10] = 0xec;
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_1c8._0_8_ = &orig_height;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
      state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013d3e70;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity = (size_type)local_1c8;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
           (size_type)boost::unit_test::lazy_ostream::inst;
      local_1a8[8] = 0;
      local_1a8._0_8_ = &PTR__lazy_ostream_013d3e70;
      uStack_190 = (undefined8 *)&local_1e8;
      local_198 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      pvVar21 = (iterator)0x1;
      pvVar22 = (iterator)0x2;
      local_1e8._0_8_ = piVar1;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&active_hash,(lazy_ostream *)local_238,1,2,REQUIRE,0xec47a5,
                 (size_t)&orig_hash,0x75,&state,"orig_tip->nHeight",local_1a8);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(active_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
      local_2e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_2d8 = "";
      local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x76;
      file_03.m_begin = (iterator)&local_2e0;
      msg_03.m_end = pvVar22;
      msg_03.m_begin = pvVar21;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2f0,
                 msg_03);
      local_238[8] = 0;
      local_238._0_8_ = &PTR__lazy_ostream_013d3cb0;
      local_228 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      pcStack_220 = "";
      active_hash.super_base_blob<256U>.m_data._M_elems[0] = fork_height == *piVar1 + -10;
      local_368._0_4_ = *piVar1 + -10;
      active_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      active_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xe7;
      orig_hash.super_base_blob<256U>.m_data._M_elems[1] = '?';
      orig_hash.super_base_blob<256U>.m_data._M_elems[2] = 0xec;
      orig_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[8] = 'I';
      orig_hash.super_base_blob<256U>.m_data._M_elems[9] = '@';
      orig_hash.super_base_blob<256U>.m_data._M_elems[10] = 0xec;
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      orig_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_1c8._0_8_ = &fork_height;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ = 0;
      state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013d3e70;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity = (size_type)local_1c8;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
           (size_type)boost::unit_test::lazy_ostream::inst;
      local_1e8._0_8_ = local_368;
      local_1a8[8] = 0;
      local_1a8._0_8_ = &PTR__lazy_ostream_013d3e70;
      uStack_190 = (undefined8 *)&local_1e8;
      local_198 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      pvVar21 = (iterator)0x1;
      pvVar22 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&active_hash,(lazy_ostream *)local_238,1,2,REQUIRE,0xec47c3,
                 (size_t)&orig_hash,0x76,&state,"orig_tip->nHeight - 10",local_1a8);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(active_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
      local_300 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
      ;
      local_2f8 = "";
      local_310 = &boost::unit_test::basic_cstring<char_const>::null;
      local_308 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x77;
      file_04.m_begin = (iterator)&local_300;
      msg_04.m_end = pvVar22;
      msg_04.m_begin = pvVar21;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_310,
                 msg_04);
      local_238[8] = 0;
      local_238._0_8_ = &PTR__lazy_ostream_013d3cb0;
      local_228 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      pcStack_220 = "";
      puVar5 = (pCVar18->m_chain).vChain.
               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Vector_impl_data._M_start[(uint)fork_height]->phashBlock;
      auVar16 = local_228;
      if (puVar5 != (uint256 *)0x0) {
        active_hash.super_base_blob<256U>.m_data._M_elems[0] =
             *(uchar *)&puVar5->super_base_blob<256U>;
        active_hash.super_base_blob<256U>.m_data._M_elems[1] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[1];
        active_hash.super_base_blob<256U>.m_data._M_elems[2] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[2];
        active_hash.super_base_blob<256U>.m_data._M_elems[3] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[3];
        active_hash.super_base_blob<256U>.m_data._M_elems[4] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[4];
        active_hash.super_base_blob<256U>.m_data._M_elems[5] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[5];
        active_hash.super_base_blob<256U>.m_data._M_elems[6] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[6];
        active_hash.super_base_blob<256U>.m_data._M_elems[7] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[7];
        active_hash.super_base_blob<256U>.m_data._M_elems[8] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[8];
        active_hash.super_base_blob<256U>.m_data._M_elems[9] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[9];
        active_hash.super_base_blob<256U>.m_data._M_elems[10] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[10];
        active_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xb];
        active_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xc];
        active_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xd];
        active_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xe];
        active_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0xf];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x10];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x11];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x12];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x13];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x14];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x15];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x16];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x17];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x18];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x19];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1a];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1b];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1c];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1d];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1e];
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
             (puVar5->super_base_blob<256U>).m_data._M_elems[0x1f];
        auVar26[0] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x10] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar26[1] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x11] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar26[2] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x12] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar26[3] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x13] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar26[4] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x14] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar26[5] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x15] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar26[6] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x16] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar26[7] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x17] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar26[8] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x18] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar26[9] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x19] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar26[10] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                       fork_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar26[0xb] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar26[0xc] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar26[0xd] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar26[0xe] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar26[0xf] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar23[0] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[0]);
        auVar23[1] = -(active_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[1]);
        auVar23[2] = -(active_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[2]);
        auVar23[3] = -(active_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[3]);
        auVar23[4] = -(active_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[4]);
        auVar23[5] = -(active_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[5]);
        auVar23[6] = -(active_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[6]);
        auVar23[7] = -(active_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[7]);
        auVar23[8] = -(active_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[8]);
        auVar23[9] = -(active_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                      fork_hash.super_base_blob<256U>.m_data._M_elems[9]);
        auVar23[10] = -(active_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                       fork_hash.super_base_blob<256U>.m_data._M_elems[10]);
        auVar23[0xb] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar23[0xc] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar23[0xd] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar23[0xe] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar23[0xf] = -(active_hash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                        fork_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar23 = auVar23 & auVar26;
        orig_hash.super_base_blob<256U>.m_data._M_elems[0] =
             (ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff;
        orig_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        local_1c8._8_8_ = "";
        local_1c8._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
        ;
        local_1e8._0_8_ = &fork_hash;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p._0_1_ =
             0;
        state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013d4988;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)&local_1e8;
        state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
             (size_type)boost::unit_test::lazy_ostream::inst;
        local_1a8[8] = 0;
        local_1a8._0_8_ = &PTR__lazy_ostream_013d4988;
        uStack_190 = (undefined8 *)local_368;
        local_198 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
        pvVar21 = (iterator)0x1;
        pvVar22 = (iterator)0x2;
        local_368._0_8_ = (assertion_result *)&active_hash;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&orig_hash,(lazy_ostream *)local_238,1,2,REQUIRE,0xec47cf,
                   (size_t)local_1c8,0x77,&state,"active[fork_height]->GetBlockHash()",local_1a8);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)(orig_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
        active_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        active_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        orig_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        local_320 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
        ;
        local_318 = "";
        local_330 = &boost::unit_test::basic_cstring<char_const>::null;
        local_328 = &boost::unit_test::basic_cstring<char_const>::null;
        file_05.m_end = (iterator)0x7a;
        file_05.m_begin = (iterator)&local_320;
        msg_05.m_end = pvVar22;
        msg_05.m_begin = pvVar21;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_330
                   ,msg_05);
        plVar7 = (lazy_ostream *)
                 (pCVar18->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1]->phashBlock;
        auVar16 = local_228;
        if (plVar7 != (lazy_ostream *)0x0) {
          local_1c8 = *(undefined1 (*) [16])plVar7;
          local_1b8 = *(undefined1 (*) [16])(plVar7 + 1);
          local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          uStack_1d0 = 0;
          local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)0x0;
          local_1e8._1_3_ = 0;
          local_1e8._4_4_ = 0;
          local_1e8.m_message.px = (element_type *)0x0;
          stack0xfffffffffffffee8 = SUB169((undefined1  [16])0x0,7);
          state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
          state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0]
               = '\0';
          state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity._1_7_ = 0;
          state.super_ValidationState<BlockValidationResult>._32_16_ = (undefined1  [16])0x0;
          state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
          state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity = 0;
          state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
          state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
          state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)0x0;
          local_168 = SUB169((undefined1  [16])0x0,0);
          uStack_15f = 0;
          local_178 = SUB169((undefined1  [16])0x0,0);
          uStack_16f = 0;
          local_188 = (undefined1  [16])0x0;
          local_198 = (undefined1  [8])0x0;
          uStack_190 = (undefined8 *)0x0;
          local_1a8._8_8_ = 0;
          local_1a8._0_8_ = &active_hash;
          Stack_1f8 = SUB169((undefined1  [16])0x0,7);
          Stack_208 = SUB169((undefined1  [16])0x0,0);
          local_1ff = 0;
          local_218 = (undefined1  [16])0x0;
          local_228 = (undefined1  [8])0x0;
          pcStack_220 = (char *)0x0;
          local_238._0_8_ = (_func_int **)0x0;
          local_238[8] = false;
          local_238._9_7_ = 0;
          _cVar29 = 0x4042c4;
          iVar19 = (*((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                      super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                      .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain
                     [0xe])();
          local_348 = (uint256 *)(CONCAT71(local_348._1_7_,(char)iVar19) ^ 1);
          local_340.px = (element_type *)0x0;
          local_340.pn.pi_ = (sp_counted_base *)0x0;
          local_350 = (undefined1 *)&local_378;
          local_378 = 
          "!chain->findCommonAncestor(active.Tip()->GetBlockHash(), {}, {}, FoundBlock().hash(active_hash), {})"
          ;
          local_370 = "";
          local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
          local_368._0_8_ = &PTR__lazy_ostream_013d3df0;
          local_358 = boost::unit_test::lazy_ostream::inst;
          local_388 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
          ;
          local_380 = "";
          pvVar21 = (iterator)0x1;
          pvVar22 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&local_348,(lazy_ostream *)local_368,1,0,WARN,_cVar29,
                     (size_t)&local_388,0x7a);
          boost::detail::shared_count::~shared_count(&local_340.pn);
          local_398 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
          ;
          local_390 = "";
          local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = (iterator)0x7b;
          file_06.m_begin = (iterator)&local_398;
          msg_06.m_end = pvVar22;
          msg_06.m_begin = pvVar21;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_3a8,msg_06);
          pCVar6 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                   super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain._M_t.
                   super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                   .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
          local_1b8._0_8_ = (_func_int **)0x0;
          local_1b8[8] = false;
          local_1b8._9_7_ = 0;
          local_1c8._0_8_ = (_func_int **)0x0;
          local_1c8[8] = false;
          local_1c8._9_7_ = 0;
          puVar5 = local_410->phashBlock;
          auVar16 = local_228;
          if (puVar5 != (uint256 *)0x0) {
            uVar8 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
            local_1e8.m_message.px =
                 *(element_type **)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
            local_1e8.m_message.pn.pi_ =
                 *(sp_counted_base **)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
            uStack_1d0 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
            local_1e8._0_4_ = SUB84(uVar8,0);
            local_1e8._4_4_ = SUB84((ulong)uVar8 >> 0x20,0);
            stack0xfffffffffffffee8 = SUB169((undefined1  [16])0x0,7);
            state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
            state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf
            [0] = '\0';
            state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._1_7_ = 0;
            state.super_ValidationState<BlockValidationResult>._32_16_ = (undefined1  [16])0x0;
            state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
            state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity = 0;
            state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
            state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
            state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
                 (pointer)0x0;
            local_168 = SUB169((undefined1  [16])0x0,7);
            local_178 = SUB169((undefined1  [16])0x0,0);
            uStack_16f = 0;
            local_188 = (undefined1  [16])0x0;
            local_198 = (undefined1  [8])0x0;
            uStack_190 = (undefined8 *)0x0;
            local_1a8 = (undefined1  [16])0x0;
            Stack_1f8 = SUB169((undefined1  [16])0x0,0);
            uStack_1ef = 0;
            Stack_208 = SUB169((undefined1  [16])0x0,0);
            local_1ff = 0;
            local_218 = (undefined1  [16])0x0;
            _local_228 = (undefined1  [16])0x0;
            local_238._8_8_ = 0;
            local_238._0_8_ = &orig_hash;
            _cVar29 = 0x40446b;
            iVar19 = (*pCVar6->_vptr_Chain[0xe])(pCVar6,local_1c8,&local_1e8,&state,local_1a8);
            local_348 = (uint256 *)(CONCAT71(local_348._1_7_,(char)iVar19) ^ 1);
            local_340.px = (element_type *)0x0;
            local_340.pn.pi_ = (sp_counted_base *)0x0;
            local_378 = 
            "!chain->findCommonAncestor({}, orig_tip->GetBlockHash(), {}, {}, FoundBlock().hash(orig_hash))"
            ;
            local_370 = "";
            local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
            local_368._0_8_ = &PTR__lazy_ostream_013d3df0;
            local_358 = boost::unit_test::lazy_ostream::inst;
            local_350 = (undefined1 *)&local_378;
            local_3b8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
            ;
            local_3b0 = "";
            pvVar21 = (iterator)0x1;
            pvVar22 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_348,(lazy_ostream *)local_368,1,0,WARN,_cVar29,
                       (size_t)&local_3b8,0x7b);
            boost::detail::shared_count::~shared_count(&local_340.pn);
            local_3c8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
            ;
            local_3c0 = "";
            local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_07.m_end = (iterator)0x7c;
            file_07.m_begin = (iterator)&local_3c8;
            msg_07.m_end = pvVar22;
            msg_07.m_begin = pvVar21;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                       (size_t)&local_3d8,msg_07);
            local_238[8] = 0;
            local_238._0_8_ = &PTR__lazy_ostream_013d3cb0;
            local_228 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
            auVar16 = local_228;
            local_228 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
            pcStack_220 = "";
            plVar7 = (lazy_ostream *)
                     (pCVar18->m_chain).vChain.
                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1]->phashBlock;
            if (plVar7 != (lazy_ostream *)0x0) {
              local_1c8 = *(undefined1 (*) [16])plVar7;
              local_1b8 = *(undefined1 (*) [16])(plVar7 + 1);
              auVar27[0] = -(*(uchar *)&plVar7[1]._vptr_lazy_ostream ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
              auVar27[1] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 1) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
              auVar27[2] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 2) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
              auVar27[3] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 3) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
              auVar27[4] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 4) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
              auVar27[5] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 5) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
              auVar27[6] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 6) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
              auVar27[7] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 7) ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
              auVar27[8] = -(plVar7[1].m_empty ==
                            (bool)active_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
              auVar27[9] = -(plVar7[1].field_0x9 ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
              auVar27[10] = -(plVar7[1].field_0xa ==
                             active_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
              auVar27[0xb] = -(plVar7[1].field_0xb ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
              auVar27[0xc] = -(plVar7[1].field_0xc ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
              auVar27[0xd] = -(plVar7[1].field_0xd ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
              auVar27[0xe] = -(plVar7[1].field_0xe ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
              auVar27[0xf] = -(plVar7[1].field_0xf ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
              auVar24[0] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[0]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[0]);
              auVar24[1] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[1]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[1]);
              auVar24[2] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[2]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[2]);
              auVar24[3] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[3]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[3]);
              auVar24[4] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[4]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[4]);
              auVar24[5] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[5]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[5]);
              auVar24[6] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[6]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[6]);
              auVar24[7] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems[7]
                            == active_hash.super_base_blob<256U>.m_data._M_elems[7]);
              auVar24[8] = -(plVar7->m_empty ==
                            (bool)active_hash.super_base_blob<256U>.m_data._M_elems[8]);
              auVar24[9] = -(plVar7->field_0x9 ==
                            active_hash.super_base_blob<256U>.m_data._M_elems[9]);
              auVar24[10] = -(plVar7->field_0xa ==
                             active_hash.super_base_blob<256U>.m_data._M_elems[10]);
              auVar24[0xb] = -(plVar7->field_0xb ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
              auVar24[0xc] = -(plVar7->field_0xc ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
              auVar24[0xd] = -(plVar7->field_0xd ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
              auVar24[0xe] = -(plVar7->field_0xe ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
              auVar24[0xf] = -(plVar7->field_0xf ==
                              active_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
              auVar24 = auVar24 & auVar27;
              local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
              value = (readonly_property<bool>)
                      (readonly_property<bool>)
                      ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                               (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff);
              local_1e8.m_message.px = (element_type *)0x0;
              local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_368._0_8_ =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
              ;
              local_368._8_8_ = "";
              local_348 = &active_hash;
              state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p.
              _0_1_ = 0;
              state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_013d4988
              ;
              state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
                   (size_type)boost::unit_test::lazy_ostream::inst;
              local_378 = local_1c8;
              local_1a8[8] = 0;
              local_1a8._0_8_ = &PTR__lazy_ostream_013d4988;
              uStack_190 = &local_378;
              local_198 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
              pvVar21 = (iterator)0x1;
              pvVar22 = (iterator)0x2;
              state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity = (size_type)(assertion_result *)&local_348;
              boost::test_tools::tt_detail::report_assertion
                        (&local_1e8,(lazy_ostream *)local_238,1,2,REQUIRE,0xec48c1,(size_t)local_368
                         ,0x7c,&state,"active.Tip()->GetBlockHash()",local_1a8);
              boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
              local_3e8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
              ;
              local_3e0 = "";
              local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_08.m_end = (iterator)0x7d;
              file_08.m_begin = (iterator)&local_3e8;
              msg_08.m_end = pvVar22;
              msg_08.m_begin = pvVar21;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                         (size_t)&local_3f8,msg_08);
              local_238[8] = 0;
              local_238._0_8_ = &PTR__lazy_ostream_013d3cb0;
              local_228 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
              pcStack_220 = "";
              plVar7 = (lazy_ostream *)local_410->phashBlock;
              auVar16 = local_228;
              local_1e8._0_8_ = (uint256 *)CONCAT44(local_1e8._4_4_,local_1e8._0_4_);
              if (plVar7 != (lazy_ostream *)0x0) {
                local_1c8 = *(undefined1 (*) [16])plVar7;
                local_1b8 = *(undefined1 (*) [16])(plVar7 + 1);
                auVar28[0] = -(*(uchar *)&plVar7[1]._vptr_lazy_ostream ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
                auVar28[1] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 1) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
                auVar28[2] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 2) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
                auVar28[3] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 3) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
                auVar28[4] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 4) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
                auVar28[5] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 5) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
                auVar28[6] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 6) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
                auVar28[7] = -(*(uchar *)((long)&plVar7[1]._vptr_lazy_ostream + 7) ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
                auVar28[8] = -(plVar7[1].m_empty ==
                              (bool)orig_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
                auVar28[9] = -(plVar7[1].field_0x9 ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
                auVar28[10] = -(plVar7[1].field_0xa ==
                               orig_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
                auVar28[0xb] = -(plVar7[1].field_0xb ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
                auVar28[0xc] = -(plVar7[1].field_0xc ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
                auVar28[0xd] = -(plVar7[1].field_0xd ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
                auVar28[0xe] = -(plVar7[1].field_0xe ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
                auVar28[0xf] = -(plVar7[1].field_0xf ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
                auVar25[0] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [0] == orig_hash.super_base_blob<256U>.m_data._M_elems[0]);
                auVar25[1] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [1] == orig_hash.super_base_blob<256U>.m_data._M_elems[1]);
                auVar25[2] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [2] == orig_hash.super_base_blob<256U>.m_data._M_elems[2]);
                auVar25[3] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [3] == orig_hash.super_base_blob<256U>.m_data._M_elems[3]);
                auVar25[4] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [4] == orig_hash.super_base_blob<256U>.m_data._M_elems[4]);
                auVar25[5] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [5] == orig_hash.super_base_blob<256U>.m_data._M_elems[5]);
                auVar25[6] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [6] == orig_hash.super_base_blob<256U>.m_data._M_elems[6]);
                auVar25[7] = -((((base_blob<256U> *)&plVar7->_vptr_lazy_ostream)->m_data)._M_elems
                               [7] == orig_hash.super_base_blob<256U>.m_data._M_elems[7]);
                auVar25[8] = -(plVar7->m_empty ==
                              (bool)orig_hash.super_base_blob<256U>.m_data._M_elems[8]);
                auVar25[9] = -(plVar7->field_0x9 ==
                              orig_hash.super_base_blob<256U>.m_data._M_elems[9]);
                auVar25[10] = -(plVar7->field_0xa ==
                               orig_hash.super_base_blob<256U>.m_data._M_elems[10]);
                auVar25[0xb] = -(plVar7->field_0xb ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
                auVar25[0xc] = -(plVar7->field_0xc ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
                auVar25[0xd] = -(plVar7->field_0xd ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
                auVar25[0xe] = -(plVar7->field_0xe ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
                auVar25[0xf] = -(plVar7->field_0xf ==
                                orig_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
                auVar25 = auVar25 & auVar28;
                local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)
                         (readonly_property<bool>)
                         ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff);
                local_1e8.m_message.px = (element_type *)0x0;
                local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_368._0_8_ =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                ;
                local_368._8_8_ = "";
                local_348 = &orig_hash;
                state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p.
                _0_1_ = 0;
                state.super_ValidationState<BlockValidationResult>._0_8_ =
                     &PTR__lazy_ostream_013d4988;
                state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity = (size_type)&local_348;
                state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length
                     = (size_type)boost::unit_test::lazy_ostream::inst;
                local_378 = local_1c8;
                local_1a8[8] = 0;
                local_1a8._0_8_ = &PTR__lazy_ostream_013d4988;
                uStack_190 = &local_378;
                local_198 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
                boost::test_tools::tt_detail::report_assertion
                          (&local_1e8,(lazy_ostream *)local_238,1,2,REQUIRE,0xec48ea,
                           (size_t)local_368,0x7d,&state,"orig_tip->GetBlockHash()",local_1a8);
                boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
                if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
                  __stack_chk_fail();
                }
                return;
              }
            }
          }
        }
      }
    }
  }
  local_228 = auVar16;
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_AUTO_TEST_CASE(findCommonAncestor)
{
    auto& chain = m_node.chain;
    const CChain& active{*WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return &Assert(m_node.chainman)->ActiveChain())};
    auto* orig_tip = active.Tip();
    for (int i = 0; i < 10; ++i) {
        BlockValidationState state;
        m_node.chainman->ActiveChainstate().InvalidateBlock(state, active.Tip());
    }
    BOOST_CHECK_EQUAL(active.Height(), orig_tip->nHeight - 10);
    coinbaseKey.MakeNewKey(true);
    for (int i = 0; i < 20; ++i) {
        CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    }
    BOOST_CHECK_EQUAL(active.Height(), orig_tip->nHeight + 10);
    uint256 fork_hash;
    int fork_height;
    int orig_height;
    BOOST_CHECK(chain->findCommonAncestor(orig_tip->GetBlockHash(), active.Tip()->GetBlockHash(), FoundBlock().height(fork_height).hash(fork_hash), FoundBlock().height(orig_height)));
    BOOST_CHECK_EQUAL(orig_height, orig_tip->nHeight);
    BOOST_CHECK_EQUAL(fork_height, orig_tip->nHeight - 10);
    BOOST_CHECK_EQUAL(fork_hash, active[fork_height]->GetBlockHash());

    uint256 active_hash, orig_hash;
    BOOST_CHECK(!chain->findCommonAncestor(active.Tip()->GetBlockHash(), {}, {}, FoundBlock().hash(active_hash), {}));
    BOOST_CHECK(!chain->findCommonAncestor({}, orig_tip->GetBlockHash(), {}, {}, FoundBlock().hash(orig_hash)));
    BOOST_CHECK_EQUAL(active_hash, active.Tip()->GetBlockHash());
    BOOST_CHECK_EQUAL(orig_hash, orig_tip->GetBlockHash());
}